

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkedAllocator.c
# Opt level: O1

void * sysbvm_chunkedAllocator_allocate
                 (sysbvm_chunkedAllocator_t *allocator,size_t size,size_t alignment)

{
  sysbvm_chunkedAllocatorChunk_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  psVar1 = sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(allocator,size,alignment);
  if (psVar1 == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/chunkedAllocator.c:111: assertion failure: chunk"
              );
  }
  uVar2 = -alignment & (psVar1->size + alignment) - 1;
  uVar3 = size + uVar2;
  psVar1->size = uVar3;
  if (psVar1->capacity < uVar3) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/chunkedAllocator.c:116: assertion failure: chunk->size <= chunk->capacity"
              );
  }
  return (void *)((long)&psVar1[1].previous + uVar2);
}

Assistant:

SYSBVM_API void* sysbvm_chunkedAllocator_allocate(sysbvm_chunkedAllocator_t *allocator, size_t size, size_t alignment)
{
    sysbvm_chunkedAllocatorChunk_t *chunk = sysbvm_chunkedAllocator_ensureChunkWithRequiredCapacity(allocator, size, alignment);
    SYSBVM_ASSERT(chunk);

    size_t alignedOffset = sysbvm_chunkedAllocator_sizeAlignedTo(chunk->size, alignment);
    uint8_t *result = (uint8_t*)(chunk + 1) + alignedOffset;
    chunk->size = alignedOffset + size;
    SYSBVM_ASSERT(chunk->size <= chunk->capacity);

    return result;
}